

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_from_v64(c_v256 *__return_storage_ptr__,c_v64 a,c_v64 b,c_v64 c,c_v64 d)

{
  __return_storage_ptr__->v64[3] = a;
  __return_storage_ptr__->v64[2] = b;
  __return_storage_ptr__->v64[1] = c;
  __return_storage_ptr__->v64[0] = d;
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE c_v256 c_v256_from_v64(c_v64 a, c_v64 b, c_v64 c, c_v64 d) {
  c_v256 t;
  t.u64[3] = a.u64;
  t.u64[2] = b.u64;
  t.u64[1] = c.u64;
  t.u64[0] = d.u64;
  return t;
}